

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcDecrypt.c
# Opt level: O3

void cbc512Decrypt(ThreefishKey_t *key,uint64_t *iv,uint64_t *cipher_text,uint64_t num_blocks)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  uint64_t *in;
  ulong local_100;
  ulong local_f8;
  uint64_t local_f0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  
  if (num_blocks << 3 != 0) {
    local_a8 = 0;
    uStack_a0 = 0;
    uVar25 = 0;
    uVar22 = 0;
    local_100 = 0;
    local_f0 = 0;
    local_f8 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_98 = 0;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    local_88 = 0;
    uStack_84 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    in = cipher_text;
    do {
      uVar14 = cipher_text[uVar25];
      uVar15 = (cipher_text + uVar25)[1];
      uVar16 = cipher_text[uVar25 + 2];
      uVar11 = (cipher_text + uVar25 + 2)[1];
      uVar12 = cipher_text[uVar25 + 4];
      uVar13 = (cipher_text + uVar25 + 4)[1];
      uVar3 = cipher_text[uVar25 + 6];
      puVar23 = in + 7;
      uVar4 = cipher_text[uVar25 + 7];
      threefishDecryptBlockWords(key,in,in);
      if ((uVar25 & 8) == 0) {
        local_88 = (uint)uVar12;
        uStack_84 = (uint)(uVar12 >> 0x20);
        uStack_80 = (uint)uVar13;
        uStack_7c = (uint)(uVar13 >> 0x20);
        local_98 = (uint)uVar16;
        uStack_94 = (uint)(uVar16 >> 0x20);
        uStack_90 = (uint)uVar11;
        uStack_8c = (uint)(uVar11 >> 0x20);
        local_78 = (uint)uVar14;
        uStack_74 = (uint)(uVar14 >> 0x20);
        uStack_70 = (uint)uVar15;
        uStack_6c = (uint)(uVar15 >> 0x20);
        uVar22 = uVar4;
        local_100 = uVar3;
        if (uVar25 == 0) {
          *cipher_text = *cipher_text ^ *iv;
          cipher_text[1] = cipher_text[1] ^ iv[1];
          cipher_text[2] = cipher_text[2] ^ iv[2];
          cipher_text[3] = cipher_text[3] ^ iv[3];
          cipher_text[4] = cipher_text[4] ^ iv[4];
          cipher_text[5] = cipher_text[5] ^ iv[5];
          cipher_text[6] = cipher_text[6] ^ iv[6];
          puVar23 = cipher_text + 7;
          uVar24 = iv[7];
        }
        else {
          puVar1 = cipher_text + uVar25;
          uVar5 = *(uint *)((long)puVar1 + 4);
          uVar3 = puVar1[1];
          uVar6 = *(uint *)((long)puVar1 + 0xc);
          puVar2 = cipher_text + uVar25 + 2;
          uVar4 = *puVar2;
          uVar7 = *(uint *)((long)puVar2 + 4);
          uVar14 = puVar2[1];
          uVar8 = *(uint *)((long)puVar2 + 0xc);
          puVar2 = cipher_text + uVar25 + 4;
          uVar15 = *puVar2;
          uVar9 = *(uint *)((long)puVar2 + 4);
          uVar16 = puVar2[1];
          uVar10 = *(uint *)((long)puVar2 + 0xc);
          puVar2 = cipher_text + uVar25;
          *(uint *)puVar2 = (uint)*puVar1 ^ (uint)local_a8;
          *(uint *)((long)puVar2 + 4) = uVar5 ^ local_a8._4_4_;
          *(uint *)(puVar2 + 1) = (uint)uVar3 ^ (uint)uStack_a0;
          *(uint *)((long)puVar2 + 0xc) = uVar6 ^ uStack_a0._4_4_;
          puVar1 = cipher_text + uVar25 + 2;
          *(uint *)puVar1 = (uint)uVar4 ^ (uint)local_b8;
          *(uint *)((long)puVar1 + 4) = uVar7 ^ local_b8._4_4_;
          *(uint *)(puVar1 + 1) = (uint)uVar14 ^ (uint)uStack_b0;
          *(uint *)((long)puVar1 + 0xc) = uVar8 ^ uStack_b0._4_4_;
          puVar1 = cipher_text + uVar25 + 4;
          *(uint *)puVar1 = (uint)uVar15 ^ (uint)local_c8;
          *(uint *)((long)puVar1 + 4) = uVar9 ^ local_c8._4_4_;
          *(uint *)(puVar1 + 1) = (uint)uVar16 ^ (uint)uStack_c0;
          *(uint *)((long)puVar1 + 0xc) = uVar10 ^ uStack_c0._4_4_;
          cipher_text[uVar25 + 6] = cipher_text[uVar25 + 6] ^ local_f8;
          uVar24 = local_f0;
        }
      }
      else {
        puVar1 = cipher_text + uVar25;
        uVar5 = *(uint *)((long)puVar1 + 4);
        uVar17 = puVar1[1];
        uVar6 = *(uint *)((long)puVar1 + 0xc);
        puVar2 = cipher_text + uVar25 + 2;
        uVar18 = *puVar2;
        uVar7 = *(uint *)((long)puVar2 + 4);
        uVar19 = puVar2[1];
        uVar8 = *(uint *)((long)puVar2 + 0xc);
        puVar2 = cipher_text + uVar25 + 4;
        uVar20 = *puVar2;
        uVar9 = *(uint *)((long)puVar2 + 4);
        uVar21 = puVar2[1];
        uVar10 = *(uint *)((long)puVar2 + 0xc);
        puVar2 = cipher_text + uVar25;
        *(uint *)puVar2 = (uint)*puVar1 ^ local_78;
        *(uint *)((long)puVar2 + 4) = uVar5 ^ uStack_74;
        *(uint *)(puVar2 + 1) = (uint)uVar17 ^ uStack_70;
        *(uint *)((long)puVar2 + 0xc) = uVar6 ^ uStack_6c;
        puVar1 = cipher_text + uVar25 + 2;
        *(uint *)puVar1 = (uint)uVar18 ^ local_98;
        *(uint *)((long)puVar1 + 4) = uVar7 ^ uStack_94;
        *(uint *)(puVar1 + 1) = (uint)uVar19 ^ uStack_90;
        *(uint *)((long)puVar1 + 0xc) = uVar8 ^ uStack_8c;
        puVar1 = cipher_text + uVar25 + 4;
        *(uint *)puVar1 = (uint)uVar20 ^ local_88;
        *(uint *)((long)puVar1 + 4) = uVar9 ^ uStack_84;
        *(uint *)(puVar1 + 1) = (uint)uVar21 ^ uStack_80;
        *(uint *)((long)puVar1 + 0xc) = uVar10 ^ uStack_7c;
        cipher_text[uVar25 + 6] = cipher_text[uVar25 + 6] ^ local_100;
        uVar24 = uVar22;
        local_f8 = uVar3;
        local_f0 = uVar4;
        local_c8 = uVar12;
        uStack_c0 = uVar13;
        local_b8 = uVar16;
        uStack_b0 = uVar11;
        local_a8 = uVar14;
        uStack_a0 = uVar15;
      }
      *puVar23 = *puVar23 ^ uVar24;
      uVar25 = uVar25 + 8;
      in = in + 8;
    } while (uVar25 < num_blocks << 3);
  }
  return;
}

Assistant:

void cbc512Decrypt(ThreefishKey_t* key,
                   const uint64_t* iv,
                   uint64_t* cipher_text,
                   const uint64_t num_blocks)
{
    pd3("cbc512Decrypt()\n");
    uint64_t prev_block_odd[SECURE_SLICE] = {0, 0, 0 ,0 ,0 ,0 ,0 ,0}; //allocate 1 block of storage to store the previous cipher text 
    uint64_t prev_block_even[SECURE_SLICE] = {0, 0, 0 ,0 ,0 ,0 ,0 ,0}; //allocate 1 block of storage to store the previous cipher text
    
    pd3("decrypting %lu blocks\n", num_blocks);
    //pBuff(32, (uint8_t*)iv);

    for(uint64_t block=0; block<(num_blocks*SECURE_SLICE); block+=SECURE_SLICE) //run each block through the cipher (in decrypt mode)
    {
        bool even = ((block/SECURE_SLICE)%2 == 0) ? true : false;

        if(even)
        {
            //save the previous cipher text block if it is even 
            prev_block_even[0] = cipher_text[block];
            prev_block_even[1] = cipher_text[block+1];
            prev_block_even[2] = cipher_text[block+2];
            prev_block_even[3] = cipher_text[block+3];
            prev_block_even[4] = cipher_text[block+4];
            prev_block_even[5] = cipher_text[block+5];
            prev_block_even[6] = cipher_text[block+6];
            prev_block_even[7] = cipher_text[block+7];
        }
	else
        {
            //save the previous cipher text block if it is odd
            prev_block_odd[0] = cipher_text[block];
            prev_block_odd[1] = cipher_text[block+1];
            prev_block_odd[2] = cipher_text[block+2];
            prev_block_odd[3] = cipher_text[block+3];
            prev_block_odd[4] = cipher_text[block+4];
            prev_block_odd[5] = cipher_text[block+5];
            prev_block_odd[6] = cipher_text[block+6];
            prev_block_odd[7] = cipher_text[block+7];
        }

        //Run the block through the cipher
        threefishDecryptBlockWords(key, &cipher_text[block], &cipher_text[block]);
        if(block == 0) //xor the first block with the initialization vector
        {
            cipher_text[0] ^= iv[0]; cipher_text[1] ^= iv[1];
            cipher_text[2] ^= iv[2]; cipher_text[3] ^= iv[3];
            cipher_text[4] ^= iv[4]; cipher_text[5] ^= iv[5];
            cipher_text[6] ^= iv[6]; cipher_text[7] ^= iv[7];
        }
        else //xor the current block with the previous block of cipher text
        {
            if(even)
            {
                cipher_text[block] ^= prev_block_odd[0];
                cipher_text[block+1] ^= prev_block_odd[1];
                cipher_text[block+2] ^= prev_block_odd[2];
                cipher_text[block+3] ^= prev_block_odd[3];
                cipher_text[block+4] ^= prev_block_odd[4];
                cipher_text[block+5] ^= prev_block_odd[5];
                cipher_text[block+6] ^= prev_block_odd[6];
                cipher_text[block+7] ^= prev_block_odd[7];
            }
            else
            {
                cipher_text[block] ^= prev_block_even[0];
                cipher_text[block+1] ^= prev_block_even[1];
                cipher_text[block+2] ^= prev_block_even[2];
                cipher_text[block+3] ^= prev_block_even[3];
                cipher_text[block+4] ^= prev_block_even[4];
                cipher_text[block+5] ^= prev_block_even[5];
                cipher_text[block+6] ^= prev_block_even[6];
                cipher_text[block+7] ^= prev_block_even[7];
            }
        }
    }
}